

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_vec2 rf_get_world_to_screen(rf_sizei screen_size,rf_vec3 position,rf_camera3d camera)

{
  double right;
  double top;
  float fVar1;
  rf_vec2 rVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  rf_mat mat_view;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_c8;
  float fStack_c4;
  float local_b8;
  float fStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  rf_mat local_58;
  
  fVar5 = position.z;
  fVar3 = (float)screen_size.width;
  fVar4 = (float)screen_size.height;
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    top = (double)camera.fovy * 0.5;
    right = (double)(fVar3 / fVar4) * top;
    rf_mat_ortho(&local_58,-right,right,-top,top,0.01,1000.0);
  }
  else {
    if (camera.type != RF_CAMERA_PERSPECTIVE) {
      local_c8 = 0.0;
      fStack_c4 = 1.0;
      local_a8 = 0.0;
      fStack_a4 = 0.0;
      fStack_a0 = 0.0;
      fStack_9c = 0.0;
      fVar1 = 1.0;
      local_dc = 0.0;
      local_e4 = 0.0;
      local_e0 = 0.0;
      local_b8 = 0.0;
      fStack_b0 = 0.0;
      local_d8 = 1.0;
      goto LAB_00123b0e;
    }
    rf_mat_perspective(&local_58,(double)(camera.fovy * 0.017453292),
                       (double)screen_size.width / (double)screen_size.height,0.01,1000.0);
  }
  local_dc = local_58.m3;
  local_e4 = local_58.m7;
  local_e0 = local_58.m11;
  local_a8 = local_58.m12;
  fStack_a4 = local_58.m13;
  fStack_a0 = local_58.m5;
  fStack_9c = local_58.m9;
  local_b8 = local_58.m8;
  fStack_b0 = local_58.m1;
  local_d8 = local_58.m0;
  local_c8 = local_58.m4;
  fStack_c4 = local_58.m5;
  fVar1 = local_58.m15;
LAB_00123b0e:
  rf_mat_look_at(&local_58,camera.position,camera.target,camera.up);
  local_88 = position.x;
  fStack_84 = position.y;
  local_58.m12 = local_58.m8 * fVar5 + local_58.m0 * local_88 + local_58.m4 * fStack_84 +
                 local_58.m12;
  local_58.m13 = local_58.m9 * fVar5 + local_58.m1 * local_88 + local_58.m5 * fStack_84 +
                 local_58.m13;
  local_58.m14 = local_58.m10 * fVar5 + local_58.m2 * local_88 + local_58.m6 * fStack_84 +
                 local_58.m14;
  local_58.m15 = fVar5 * local_58.m11 + local_58.m3 * local_88 + fStack_84 * local_58.m7 +
                 local_58.m15;
  fVar5 = fVar1 * local_58.m15 +
          local_e0 * local_58.m14 + local_dc * local_58.m12 + local_e4 * local_58.m13;
  auVar6._0_4_ = local_58.m15 * local_a8 +
                 local_58.m14 * local_b8 + local_58.m12 * local_d8 + local_58.m13 * local_c8;
  auVar6._4_4_ = local_58.m15 * fStack_a4 +
                 local_58.m14 * fStack_9c + local_58.m12 * fStack_b0 + local_58.m13 * fStack_c4;
  auVar6._8_4_ = local_58.m15 * fStack_a0 +
                 local_58.m14 * fStack_b0 + local_58.m12 * local_b8 + local_58.m13 * local_a8;
  auVar6._12_4_ =
       local_58.m15 * fStack_9c +
       local_58.m14 * fStack_a0 + local_58.m12 * local_a8 + local_58.m13 * fStack_b0;
  auVar7._4_4_ = fVar5;
  auVar7._0_4_ = fVar5;
  auVar7._8_4_ = fVar5;
  auVar7._12_4_ = fVar5;
  auVar7 = divps(auVar6,auVar7);
  rVar2.x = (auVar7._0_4_ + 1.0) * 0.5 * fVar3;
  rVar2.y = (1.0 - auVar7._4_4_) * 0.5 * fVar4;
  return rVar2;
}

Assistant:

RF_API rf_vec2 rf_get_world_to_screen(rf_sizei screen_size, rf_vec3 position, rf_camera3d camera)
{
    // Calculate projection matrix from perspective instead of frustum
    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

    // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Calculate view matrix from camera look at (and transpose it)
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    // Convert world position vector to quaternion
    rf_quaternion world_pos = { position.x, position.y, position.z, 1.0f };

    // Transform world position to view
    world_pos = rf_quaternion_transform(world_pos, mat_view);

    // Transform result to projection (clip space position)
    world_pos = rf_quaternion_transform(world_pos, mat_proj);

    // Calculate normalized device coordinates (inverted y)
    rf_vec3 ndc_pos = {world_pos.x / world_pos.w, -world_pos.y / world_pos.w, world_pos.z / world_pos.w};

    // Calculate 2d screen position vector
    rf_vec2 screen_position = {(ndc_pos.x + 1.0f) / 2.0f * (float) screen_size.width,
                               (ndc_pos.y + 1.0f) / 2.0f * (float) screen_size.height};

    return screen_position;
}